

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Command.h
# Opt level: O0

void __thiscall llbuild::buildsystem::Command::addOutput(Command *this,BuildNode *node)

{
  vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_> *this_00
  ;
  Command *local_20;
  BuildNode *local_18;
  BuildNode *node_local;
  Command *this_local;
  
  local_18 = node;
  node_local = (BuildNode *)this;
  std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  ::push_back(&this->outputs,&local_18);
  this_00 = Node::getProducers(&local_18->super_Node);
  local_20 = this;
  std::vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>::
  push_back(this_00,&local_20);
  return;
}

Assistant:

virtual void addOutput(BuildNode* node) final {
    outputs.push_back(node);
    node->getProducers().push_back(this);
  }